

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::replace_extension(SmallVectorImpl<char> *path,Twine *extension,Style style)

{
  void *pvVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  iterator in_start;
  iterator in_end;
  Style style_00;
  StringRef str;
  char local_b1;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_b0 [8];
  size_t local_a8;
  size_t local_a0;
  size_t pos;
  StringRef ext;
  SmallString<32U> ext_storage;
  StringRef p;
  Style style_local;
  Twine *extension_local;
  SmallVectorImpl<char> *path_local;
  
  pvVar1 = (path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)path);
  sVar4 = sVar3;
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       pvVar1;
  SmallString<32U>::SmallString((SmallString<32U> *)&ext.Length);
  style_00 = (Style)sVar4;
  _pos = Twine::toStringRef(extension,(SmallVectorImpl<char> *)&ext.Length);
  sVar4 = StringRef::find_last_of
                    ((StringRef *)
                     (ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                      InlineElts + 0x18),'.',0xffffffffffffffff);
  local_a0 = sVar4;
  if (sVar4 != 0xffffffffffffffff) {
    local_b0[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x18].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    local_b0[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x19].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    local_b0[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1a].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    local_b0[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1b].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    local_b0[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1c].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    local_b0[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1d].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    local_b0[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1e].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    local_b0[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
         [0x1f].super_AlignedCharArray<1UL,_1UL>.buffer[0];
    str.Length._0_4_ = style;
    str.Data = (char *)sVar3;
    str.Length._4_4_ = 0;
    local_a8 = sVar3;
    sVar3 = anon_unknown.dwarf_208f76::filename_pos
                      ((anon_unknown_dwarf_208f76 *)
                       ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                       InlineElts._24_8_,str,style_00);
    if (sVar3 <= sVar4) {
      SmallVectorBase::set_size((SmallVectorBase *)path,local_a0);
    }
  }
  if (ext.Data != (char *)0x0) {
    cVar2 = StringRef::operator[]((StringRef *)&pos,0);
    if (cVar2 != '.') {
      local_b1 = '.';
      SmallVectorTemplateBase<char,_true>::push_back
                (&path->super_SmallVectorTemplateBase<char,_true>,&local_b1);
    }
  }
  in_start = StringRef::begin((StringRef *)&pos);
  in_end = StringRef::end((StringRef *)&pos);
  SmallVectorImpl<char>::append<char_const*,void>(path,in_start,in_end);
  SmallString<32U>::~SmallString((SmallString<32U> *)&ext.Length);
  return;
}

Assistant:

void replace_extension(SmallVectorImpl<char> &path, const Twine &extension,
                       Style style) {
  StringRef p(path.begin(), path.size());
  SmallString<32> ext_storage;
  StringRef ext = extension.toStringRef(ext_storage);

  // Erase existing extension.
  size_t pos = p.find_last_of('.');
  if (pos != StringRef::npos && pos >= filename_pos(p, style))
    path.set_size(pos);

  // Append '.' if needed.
  if (ext.size() > 0 && ext[0] != '.')
    path.push_back('.');

  // Append extension.
  path.append(ext.begin(), ext.end());
}